

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

bool __thiscall
flatbuffers::cpp::CppGenerator::FlexibleStringConstructor(CppGenerator *this,FieldDef *field)

{
  Value *pVVar1;
  bool bVar2;
  allocator<char> local_41;
  string local_40;
  
  if (field == (FieldDef *)0x0) {
    bVar2 = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"cpp_str_flex_ctor",&local_41);
    pVVar1 = SymbolTable<flatbuffers::Value>::Lookup
                       (&(field->super_Definition).attributes,&local_40);
    bVar2 = pVVar1 != (Value *)0x0;
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((bVar2) ||
     (((this->opts_).super_IDLOptions.cpp_object_api_string_flexible_constructor & 1U) != 0)) {
    NativeString_abi_cxx11_(&local_40,this,field);
    bVar2 = std::operator!=(&local_40,"std::string");
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool FlexibleStringConstructor(const FieldDef *field) {
    auto attr = field != nullptr &&
                (field->attributes.Lookup("cpp_str_flex_ctor") != nullptr);
    auto ret = attr ? attr : opts_.cpp_object_api_string_flexible_constructor;
    return ret && NativeString(field) !=
                      "std::string";  // Only for custom string types.
  }